

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O2

ComplexPair * __thiscall
Iir::BandStopTransform::transform
          (ComplexPair *__return_storage_ptr__,BandStopTransform *this,complex_t c)

{
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  double in_XMM1_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  if (INFINITY <= in_XMM0_Qa) {
    dVar1 = 0.0;
    local_38 = -1.0;
    if ((in_XMM1_Qa == 0.0) && (!NAN(in_XMM1_Qa))) goto LAB_00104a18;
  }
  dVar1 = in_XMM0_Qa + 1.0;
  dStack_60 = -in_XMM1_Qa;
  local_68 = 1.0 - in_XMM0_Qa;
  local_58 = dVar1;
  std::operator/((complex<double> *)&local_58,(complex<double> *)&local_68);
  local_38 = extraout_XMM0_Qa;
LAB_00104a18:
  dVar3 = (this->b2 + this->a2 + -1.0) * 4.0;
  dStack_50 = dVar3 * dVar1 + 0.0;
  dVar2 = 1.0;
  local_58 = ((this->b2 - this->a2) + 1.0) * 8.0 + local_38 * dVar3 + 0.0;
  dStack_30 = dVar1;
  std::complex<double>::operator*=((complex<double> *)&local_58,(complex<double> *)&local_38);
  local_58 = (this->a2 + this->b2 + -1.0) * 4.0 + local_58;
  std::sqrt<double>((complex<double> *)&local_58);
  dVar1 = this->a;
  local_68 = extraout_XMM0_Qa_00 * -0.5 + dVar1 + -dVar1 * local_38;
  dStack_60 = dVar2 * -0.5 + -dVar1 * dStack_30;
  local_58 = -dVar1 * local_38 + extraout_XMM0_Qa_00 * 0.5 + dVar1;
  dStack_50 = -dVar1 * dStack_30 + dVar2 * 0.5;
  dVar1 = this->b + -1.0;
  local_48 = dVar1 * local_38 + this->b + 1.0;
  dStack_40 = dVar1 * dStack_30 + 0.0;
  dVar1 = local_38;
  std::operator/((complex<double> *)&local_58,(complex<double> *)&local_48);
  dVar2 = dVar1;
  std::operator/((complex<double> *)&local_68,(complex<double> *)&local_48);
  *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).first._M_value = extraout_XMM0_Qa_01
  ;
  *(double *)((__return_storage_ptr__->super_complex_pair_t).first._M_value + 8) = dVar1;
  *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).second._M_value =
       extraout_XMM0_Qa_02;
  *(double *)((__return_storage_ptr__->super_complex_pair_t).second._M_value + 8) = dVar2;
  return __return_storage_ptr__;
}

Assistant:

ComplexPair BandStopTransform::transform (complex_t c)
{
	if (c == infinity())
		c = -1;
	else
		c = (1. + c) / (1. - c); // bilinear
	
	complex_t u (0);
	u = addmul (u, 4 * (b2 + a2 - 1), c);
	u += 8 * (b2 - a2 + 1);
	u *= c;
	u += 4 * (a2 + b2 - 1);
	u = std::sqrt (u);
	
	complex_t v = u * -.5;
	v += a;
	v = addmul (v, -a, c);
	
	u *= .5;
	u += a;
	u = addmul (u, -a, c);
	
	complex_t d (b + 1);
	d = addmul (d, b-1, c);
	
	return ComplexPair (u/d, v/d);
}